

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateGLImpl::
PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
::HandleLinkingPrograms
          (PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
           *this,bool WaitForCompletion)

{
  SHADER_TYPE ShaderType;
  SharedGLProgramPtr *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PSO_CREATE_INTERNAL_FLAGS *pPVar3;
  char *__s;
  undefined8 uVar4;
  undefined8 uVar5;
  bool WaitForCompletion_00;
  LinkStatus LVar6;
  RenderDeviceGLImpl *pRVar7;
  pointer ppSVar8;
  ostream *poVar9;
  size_t sVar10;
  char (*in_RCX) [34];
  pointer ppSVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  SHADER_TYPE ActiveStages;
  PSO_CREATE_INTERNAL_FLAGS InternalFlags;
  undefined7 in_register_00000031;
  PipelineStateGLImpl *this_00;
  char (*in_R8) [19];
  ulong uVar12;
  long lVar13;
  string _msg;
  string msg;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [28];
  undefined4 local_1cc;
  size_type *local_1c8 [2];
  size_type local_1b8 [2];
  string local_1a8;
  Uint32 local_188;
  ios_base local_138 [264];
  
  if ((this->super_PipelineBuilderBase).m_State != LinkingPrograms) {
    FormatString<char[26],char[34]>
              (&local_1a8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::LinkingPrograms",in_RCX);
    DebugAssertionFailed
              (local_1a8._M_dataplus._M_p,"HandleLinkingPrograms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x177);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
  }
  local_1cc = (undefined4)CONCAT71(in_register_00000031,WaitForCompletion);
  ppSVar8 = (this->super_PipelineBuilderBase).m_Shaders.
            super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar11 = (this->super_PipelineBuilderBase).m_Shaders.
             super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar8 == ppSVar11) {
    ActiveStages = SHADER_TYPE_UNKNOWN;
  }
  else {
    ActiveStages = SHADER_TYPE_UNKNOWN;
    do {
      ShaderType = ((*ppSVar8)->super_ShaderBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                   .m_Desc.ShaderType;
      if ((ShaderType & ActiveStages) != SHADER_TYPE_UNKNOWN) {
        local_1f8._0_8_ = GetShaderTypeLiteralName(ShaderType);
        FormatString<char[14],char_const*,char[19]>
                  (&local_1a8,(Diligent *)"Shader stage ",(char (*) [14])local_1f8,
                   (char **)" is already active",in_R8);
        DebugAssertionFailed
                  (local_1a8._M_dataplus._M_p,"HandleLinkingPrograms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x17e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
      }
      ActiveStages = ShaderType | ActiveStages;
      ppSVar8 = ppSVar8 + 1;
    } while (ppSVar8 != ppSVar11);
  }
  this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
  if (this_00->m_IsProgramPipelineSupported == true) {
    ppSVar8 = (this->super_PipelineBuilderBase).m_Shaders.
              super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppSVar11 = (this->super_PipelineBuilderBase).m_Shaders.
               super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar11 != ppSVar8) {
      uVar12 = 0;
      do {
        if (this_00->m_GLPrograms[uVar12].
            super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          local_1a8._M_dataplus._M_p = (pointer)(ppSVar8 + uVar12);
          local_1a8._M_string_length._0_4_ = 1;
          local_1a8._M_string_length._4_1_ = 1;
          local_188 = (this->m_CreateInfo).
                      super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
                      .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.
                      ResourceSignaturesCount;
          local_1a8.field_2._M_allocated_capacity = (size_type)(PipelineResourceLayoutDesc *)0x0;
          if (local_188 == 0) {
            local_1a8.field_2._M_allocated_capacity =
                 (size_type)
                 &(this->m_CreateInfo).
                  super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
                  .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.
                  ResourceLayout;
          }
          local_1a8.field_2._8_8_ =
               (this->m_CreateInfo).
               super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
               .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.
               ppResourceSignatures;
          pRVar7 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                   ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                                *)this_00);
          GLProgramCache::GetProgram
                    ((GLProgramCache *)local_1f8,(GetProgramAttribs *)&pRVar7->m_ProgramCache);
          uVar5 = local_1f8._8_8_;
          uVar4 = local_1f8._0_8_;
          pSVar1 = ((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms;
          local_1f8._0_8_ = (element_type *)0x0;
          local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var2 = pSVar1[uVar12].
                   super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          pSVar1 = pSVar1 + uVar12;
          (pSVar1->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (element_type *)uVar4;
          (pSVar1->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
          }
          this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
          ppSVar8 = (this->super_PipelineBuilderBase).m_Shaders.
                    super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          this_00->m_ShaderTypes[uVar12] =
               (ppSVar8[uVar12]->super_ShaderBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
               .m_Desc.ShaderType;
          ppSVar11 = (this->super_PipelineBuilderBase).m_Shaders.
                     super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)ppSVar11 - (long)ppSVar8 >> 3));
    }
  }
  else if ((this_00->m_GLPrograms->
           super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
           (element_type *)0x0) {
    local_1a8._M_dataplus._M_p =
         (pointer)(this->super_PipelineBuilderBase).m_Shaders.
                  super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1a8._M_string_length._0_4_ =
         (undefined4)
         ((ulong)((long)(this->super_PipelineBuilderBase).m_Shaders.
                        super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1a8._M_dataplus._M_p) >> 3);
    local_1a8._M_string_length._4_1_ = 0;
    local_188 = (this->m_CreateInfo).
                super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
                .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.
                ResourceSignaturesCount;
    local_1a8.field_2._M_allocated_capacity = (size_type)(PipelineResourceLayoutDesc *)0x0;
    if (local_188 == 0) {
      local_1a8.field_2._M_allocated_capacity =
           (size_type)
           &(this->m_CreateInfo).
            super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
            .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.
            ResourceLayout;
    }
    local_1a8.field_2._8_8_ =
         (this->m_CreateInfo).
         super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
         .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.ppResourceSignatures;
    pRVar7 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                          *)this_00);
    GLProgramCache::GetProgram
              ((GLProgramCache *)local_1f8,(GetProgramAttribs *)&pRVar7->m_ProgramCache);
    uVar5 = local_1f8._8_8_;
    uVar4 = local_1f8._0_8_;
    pSVar1 = ((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms;
    local_1f8._0_8_ = (element_type *)0x0;
    local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (pSVar1->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (pSVar1->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)uVar4;
    (pSVar1->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
    }
    this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
    *this_00->m_ShaderTypes = ActiveStages;
  }
  if (this_00->m_NumPrograms != '\0') {
    lVar13 = 0;
    WaitForCompletion_00 = local_1cc._0_1_;
    uVar12 = 0;
    do {
      LVar6 = GLProgram::GetLinkStatus
                        (*(GLProgram **)
                          ((long)&(this_00->m_GLPrograms->
                                  super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + lVar13),WaitForCompletion_00);
      if (LVar6 == InProgress) {
        return;
      }
      if (LVar6 == Failed) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Failed to link program ",0x17);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," for pipeline state \'",0x15);
        __s = (((this->super_PipelineBuilderBase).m_Pipeline)->
              super_PipelineStateBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
              .m_Desc.super_DeviceObjectAttribs.Name;
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
        }
        else {
          sVar10 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\': ",3);
        lVar13 = *(long *)((long)&(((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms->
                                  super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + lVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,*(char **)(lVar13 + 0x28),*(long *)(lVar13 + 0x30));
        if ((this->super_PipelineBuilderBase).m_CreateAsynchronously == true) {
          std::__cxx11::stringbuf::str();
          FormatString<std::__cxx11::string>((string *)local_1f8,(Diligent *)local_1c8,Args);
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(2,local_1f8._0_8_,0,0,0);
          }
        }
        else {
          std::__cxx11::stringbuf::str();
          LogError<true,std::__cxx11::string>
                    (false,"HandleLinkingPrograms",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                     ,0x1bb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1f8);
        }
        if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
          operator_delete((void *)local_1f8._0_8_,local_1e8._0_8_ + 1);
        }
        (this->super_PipelineBuilderBase).m_State = Failed;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        return;
      }
      uVar12 = uVar12 + 1;
      this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
      lVar13 = lVar13 + 0x10;
    } while (uVar12 < this_00->m_NumPrograms);
  }
  pPVar3 = (PSO_CREATE_INTERNAL_FLAGS *)
           (this->m_CreateInfo).
           super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
           .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.pInternalData;
  if (pPVar3 == (PSO_CREATE_INTERNAL_FLAGS *)0x0) {
    InternalFlags = PSO_CREATE_INTERNAL_FLAG_NONE;
  }
  else {
    InternalFlags = *pPVar3;
  }
  InitResourceLayout(this_00,InternalFlags,&(this->super_PipelineBuilderBase).m_Shaders,ActiveStages
                    );
  (this->super_PipelineBuilderBase).m_State = Complete;
  return;
}

Assistant:

void HandleLinkingPrograms(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::LinkingPrograms);

        // Get active shader stages
        SHADER_TYPE ActiveStages = SHADER_TYPE_UNKNOWN;
        for (const ShaderGLImpl* pShaderGL : m_Shaders)
        {
            const auto ShaderType = pShaderGL->GetDesc().ShaderType;
            VERIFY((ActiveStages & ShaderType) == 0, "Shader stage ", GetShaderTypeLiteralName(ShaderType), " is already active");
            ActiveStages |= ShaderType;
        }

        // Create programs

        // Linking programs may be epxensive, so we cache programs keyed by shader IDs and resource signature IDs or resource layout.
        if (m_Pipeline.m_IsProgramPipelineSupported)
        {
            for (size_t i = 0; i < m_Shaders.size(); ++i)
            {
                if (!m_Pipeline.m_GLPrograms[i])
                {
                    GLProgramCache::GetProgramAttribs ProgAttribs{
                        &m_Shaders[i],
                        1,
                        true, // IsSeparableProgram
                        m_CreateInfo.ResourceSignaturesCount == 0 ? &m_CreateInfo.PSODesc.ResourceLayout : nullptr,
                        m_CreateInfo.ppResourceSignatures,
                        m_CreateInfo.ResourceSignaturesCount,
                    };
                    m_Pipeline.m_GLPrograms[i]  = m_Pipeline.GetDevice()->GetProgramCache().GetProgram(ProgAttribs);
                    m_Pipeline.m_ShaderTypes[i] = m_Shaders[i]->GetDesc().ShaderType;
                }
            }
        }
        else
        {
            if (!m_Pipeline.m_GLPrograms[0])
            {
                GLProgramCache::GetProgramAttribs ProgAttribs{
                    m_Shaders.data(),
                    static_cast<Uint32>(m_Shaders.size()),
                    false, // IsSeparableProgram
                    m_CreateInfo.ResourceSignaturesCount == 0 ? &m_CreateInfo.PSODesc.ResourceLayout : nullptr,
                    m_CreateInfo.ppResourceSignatures,
                    m_CreateInfo.ResourceSignaturesCount,
                };
                m_Pipeline.m_GLPrograms[0]  = m_Pipeline.GetDevice()->GetProgramCache().GetProgram(ProgAttribs);
                m_Pipeline.m_ShaderTypes[0] = ActiveStages;
            }
        }

        // Check program linking status
        for (Uint32 i = 0; i < m_Pipeline.m_NumPrograms; ++i)
        {
            GLProgram::LinkStatus LinkStatus = m_Pipeline.m_GLPrograms[i]->GetLinkStatus(WaitForCompletion);
            if (LinkStatus == GLProgram::LinkStatus::InProgress)
            {
                return;
            }
            else if (LinkStatus == GLProgram::LinkStatus::Failed)
            {
                std::ostringstream ss;
                ss << "Failed to link program " << i << " for pipeline state '" << m_Pipeline.m_Desc.Name << "': " << m_Pipeline.m_GLPrograms[i]->GetInfoLog();
                if (m_CreateAsynchronously)
                {
                    LOG_ERROR_MESSAGE(ss.str());
                }
                else
                {
                    LOG_ERROR_AND_THROW(ss.str());
                }
                m_State = State::Failed;
                return;
            }
        }

        m_Pipeline.InitResourceLayout(GetInternalCreateFlags(m_CreateInfo), m_Shaders, ActiveStages);
        m_State = State::Complete;
    }